

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_tile(opj_j2k_t *p_j2k,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                           OPJ_UINT32 p_data_size,opj_stream_private_t *p_stream,
                           opj_event_mgr_t *p_manager)

{
  opj_tcd_t *p_tcd;
  OPJ_BOOL OVar1;
  undefined4 in_register_0000000c;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  
  OVar1 = opj_j2k_pre_write_tile
                    (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                     (opj_event_mgr_t *)CONCAT44(in_register_0000000c,p_data_size));
  if (OVar1 == 0) {
    pcVar2 = "Error while opj_j2k_pre_write_tile with tile index = %d\n";
LAB_0010f641:
    opj_event_msg(p_manager,1,pcVar2,p_tile_index);
  }
  else {
    uVar4 = 0xffffffffffffffff;
    lVar3 = 0;
    do {
      p_tcd = p_j2k->m_tcd;
      uVar4 = uVar4 + 1;
      if (p_tcd->image->numcomps <= uVar4) {
        OVar1 = opj_tcd_copy_tile_data(p_tcd,p_data,p_data_size);
        if (OVar1 == 0) {
          pcVar2 = "Size mismatch between tile data and sent data.";
          goto LAB_0010f689;
        }
        OVar1 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
        if (OVar1 != 0) {
          return 1;
        }
        pcVar2 = "Error while opj_j2k_post_write_tile with tile index = %d\n";
        goto LAB_0010f641;
      }
      OVar1 = opj_alloc_tile_component_data
                        ((opj_tcd_tilecomp_t *)((long)&p_tcd->tcd_image->tiles->comps->x0 + lVar3));
      lVar3 = lVar3 + 0x40;
    } while (OVar1 != 0);
    pcVar2 = "Error allocating tile component data.";
LAB_0010f689:
    opj_event_msg(p_manager,1,pcVar2);
  }
  return 0;
}

Assistant:

OPJ_BOOL opj_j2k_write_tile (opj_j2k_t * p_j2k,
                                                 OPJ_UINT32 p_tile_index,
                                                 OPJ_BYTE * p_data,
                                                 OPJ_UINT32 p_data_size,
                                                 opj_stream_private_t *p_stream,
                                                 opj_event_mgr_t * p_manager )
{
        if (! opj_j2k_pre_write_tile(p_j2k,p_tile_index,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Error while opj_j2k_pre_write_tile with tile index = %d\n", p_tile_index);
                return OPJ_FALSE;
        }
        else {
                OPJ_UINT32 j;
                /* Allocate data */
                for (j=0;j<p_j2k->m_tcd->image->numcomps;++j) {
                        opj_tcd_tilecomp_t* l_tilec = p_j2k->m_tcd->tcd_image->tiles->comps + j;

                        if(! opj_alloc_tile_component_data(l_tilec)) {
												        opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data." );
                                return OPJ_FALSE;
                        }
                }

                /* now copy data into the tile component */
                if (! opj_tcd_copy_tile_data(p_j2k->m_tcd,p_data,p_data_size)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Size mismatch between tile data and sent data." );
                        return OPJ_FALSE;
                }
                if (! opj_j2k_post_write_tile(p_j2k,p_stream,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Error while opj_j2k_post_write_tile with tile index = %d\n", p_tile_index);
                        return OPJ_FALSE;
                }
        }

        return OPJ_TRUE;
}